

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_unique_ptr.hpp
# Opt level: O0

void __thiscall
Catch::Detail::
unique_ptr<Catch::Generators::FixedValuesGenerator<std::tuple<float,_float,_float>_>_>::~unique_ptr
          (unique_ptr<Catch::Generators::FixedValuesGenerator<std::tuple<float,_float,_float>_>_>
           *this)

{
  FixedValuesGenerator<std::tuple<float,_float,_float>_> *this_00;
  unique_ptr<Catch::Generators::FixedValuesGenerator<std::tuple<float,_float,_float>_>_> *this_local
  ;
  
  this_00 = this->m_ptr;
  if (this_00 != (FixedValuesGenerator<std::tuple<float,_float,_float>_> *)0x0) {
    Catch::Generators::FixedValuesGenerator<std::tuple<float,_float,_float>_>::~FixedValuesGenerator
              (this_00);
    operator_delete(this_00,0x50);
  }
  return;
}

Assistant:

~unique_ptr() {
            delete m_ptr;
        }